

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

size_t __thiscall
pugi::xpath_query::evaluate_string(xpath_query *this,char_t *buffer,size_t capacity,xpath_node *n)

{
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  char_t *__src;
  xpath_node *in_RCX;
  ulong in_RDX;
  xpath_stack_data *in_RSI;
  long *in_RDI;
  size_t size;
  size_t full_size;
  xpath_string r;
  xpath_stack_data sd;
  xpath_context c;
  xpath_stack_data *in_stack_ffffffffffffdef0;
  ulong local_2100;
  xpath_string local_20c0 [60];
  xpath_stack *in_stack_ffffffffffffe4e0;
  xpath_context *in_stack_ffffffffffffe4e8;
  xpath_ast_node *in_stack_ffffffffffffe4f0;
  byte local_48;
  xpath_context local_40;
  ulong local_18;
  xpath_stack_data *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  impl::anon_unknown_0::xpath_context::xpath_context(&local_40,in_RCX,1,1);
  impl::anon_unknown_0::xpath_stack_data::xpath_stack_data(in_stack_ffffffffffffdef0);
  if (*in_RDI == 0) {
    impl::anon_unknown_0::xpath_string::xpath_string(local_20c0);
  }
  else {
    impl::anon_unknown_0::xpath_ast_node::eval_string
              (in_stack_ffffffffffffe4f0,in_stack_ffffffffffffe4e8,in_stack_ffffffffffffe4e0);
  }
  if ((local_48 & 1) == 0) {
    sVar2 = impl::anon_unknown_0::xpath_string::length((xpath_string *)in_stack_ffffffffffffdef0);
    uVar3 = sVar2 + 1;
    if (local_18 != 0) {
      local_2100 = uVar3;
      if (local_18 <= uVar3) {
        local_2100 = local_18;
      }
      in_stack_ffffffffffffdef0 = local_10;
      __src = impl::anon_unknown_0::xpath_string::c_str(local_20c0);
      memcpy(in_stack_ffffffffffffdef0,__src,local_2100 - 1);
      *(undefined1 *)((long)local_10->blocks + (local_2100 - 1)) = 0;
    }
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(in_stack_ffffffffffffdef0);
    return uVar3;
  }
  uVar1 = __cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc((bad_alloc *)in_stack_ffffffffffffdef0);
  __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

PUGI_IMPL_FN size_t xpath_query::evaluate_string(char_t* buffer, size_t capacity, const xpath_node& n) const
	{
		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_string r = _impl ? static_cast<impl::xpath_query_impl*>(_impl)->root->eval_string(c, sd.stack) : impl::xpath_string();

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			r = impl::xpath_string();
		#else
			throw std::bad_alloc();
		#endif
		}

		size_t full_size = r.length() + 1;

		if (capacity > 0)
		{
			size_t size = (full_size < capacity) ? full_size : capacity;
			assert(size > 0);

			memcpy(buffer, r.c_str(), (size - 1) * sizeof(char_t));
			buffer[size - 1] = 0;
		}

		return full_size;
	}